

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

_Bool mpack_utf8_check_impl(uint8_t *str,size_t count,_Bool allow_null)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  uint uVar5;
  uint32_t z_2;
  uint8_t cont3;
  uint8_t cont2_1;
  uint8_t cont1_1;
  uint32_t z_1;
  uint8_t cont2;
  uint8_t cont1;
  uint32_t z;
  uint8_t cont;
  uint8_t lead;
  _Bool allow_null_local;
  size_t count_local;
  uint8_t *str_local;
  
  _z = count;
  count_local = (size_t)str;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          if (_z == 0) {
            return true;
          }
          bVar4 = *(byte *)count_local;
          if ((!allow_null) && (bVar4 == 0)) {
            return false;
          }
          if (0x7f < bVar4) break;
          count_local = count_local + 1;
          _z = _z - 1;
        }
        if ((bVar4 & 0xe0) != 0xc0) break;
        if (_z < 2) {
          return false;
        }
        pbVar1 = (byte *)(count_local + 1);
        if ((*pbVar1 & 0xc0) != 0x80) {
          return false;
        }
        count_local = count_local + 2;
        _z = _z - 2;
        if (((bVar4 & 0xffffff1f) << 6 | *pbVar1 & 0xffffff3f) < 0x80) {
          return false;
        }
      }
      if ((bVar4 & 0xf0) == 0xe0) break;
      if ((bVar4 & 0xf8) != 0xf0) {
        return false;
      }
      if (_z < 4) {
        return false;
      }
      pbVar1 = (byte *)(count_local + 1);
      if ((*pbVar1 & 0xc0) != 0x80) {
        return false;
      }
      pbVar2 = (byte *)(count_local + 2);
      if ((*pbVar2 & 0xc0) != 0x80) {
        return false;
      }
      pbVar3 = (byte *)(count_local + 3);
      if ((*pbVar3 & 0xc0) != 0x80) {
        return false;
      }
      count_local = count_local + 4;
      _z = _z - 4;
      uVar5 = (bVar4 & 0xffffff07) << 0x12 | (*pbVar1 & 0xffffff3f) << 0xc |
              (*pbVar2 & 0xffffff3f) << 6 | *pbVar3 & 0xffffff3f;
      if (uVar5 < 0x10000) {
        return false;
      }
      if (0x10ffff < uVar5) {
        return false;
      }
    }
    if (_z < 3) {
      return false;
    }
    pbVar1 = (byte *)(count_local + 1);
    if ((*pbVar1 & 0xc0) != 0x80) {
      return false;
    }
    pbVar2 = (byte *)(count_local + 2);
    if ((*pbVar2 & 0xc0) != 0x80) {
      return false;
    }
    count_local = count_local + 3;
    _z = _z - 3;
    uVar5 = (bVar4 & 0xffffff0f) << 0xc | (*pbVar1 & 0xffffff3f) << 6 | *pbVar2 & 0xffffff3f;
    if (uVar5 < 0x800) break;
    if ((0xd7ff < uVar5) && (uVar5 < 0xe000)) {
      return false;
    }
  }
  return false;
}

Assistant:

static bool mpack_utf8_check_impl(const uint8_t* str, size_t count, bool allow_null) {
    while (count > 0) {
        uint8_t lead = str[0];

        // NUL
        if (!allow_null && lead == '\0') // we don't allow NUL bytes in MPack C-strings
            return false;

        // ASCII
        if (lead <= 0x7F) {
            ++str;
            --count;

        // 2-byte sequence
        } else if ((lead & 0xE0) == 0xC0) {
            if (count < 2) // truncated sequence
                return false;

            uint8_t cont = str[1];
            if ((cont & 0xC0) != 0x80) // not a continuation byte
                return false;

            str += 2;
            count -= 2;

            uint32_t z = ((uint32_t)(lead & ~0xE0) << 6) |
                          (uint32_t)(cont & ~0xC0);

            if (z < 0x80) // overlong sequence
                return false;

        // 3-byte sequence
        } else if ((lead & 0xF0) == 0xE0) {
            if (count < 3) // truncated sequence
                return false;

            uint8_t cont1 = str[1];
            if ((cont1 & 0xC0) != 0x80) // not a continuation byte
                return false;
            uint8_t cont2 = str[2];
            if ((cont2 & 0xC0) != 0x80) // not a continuation byte
                return false;

            str += 3;
            count -= 3;

            uint32_t z = ((uint32_t)(lead  & ~0xF0) << 12) |
                         ((uint32_t)(cont1 & ~0xC0) <<  6) |
                          (uint32_t)(cont2 & ~0xC0);

            if (z < 0x800) // overlong sequence
                return false;
            if (z >= 0xD800 && z <= 0xDFFF) // surrogate
                return false;

        // 4-byte sequence
        } else if ((lead & 0xF8) == 0xF0) {
            if (count < 4) // truncated sequence
                return false;

            uint8_t cont1 = str[1];
            if ((cont1 & 0xC0) != 0x80) // not a continuation byte
                return false;
            uint8_t cont2 = str[2];
            if ((cont2 & 0xC0) != 0x80) // not a continuation byte
                return false;
            uint8_t cont3 = str[3];
            if ((cont3 & 0xC0) != 0x80) // not a continuation byte
                return false;

            str += 4;
            count -= 4;

            uint32_t z = ((uint32_t)(lead  & ~0xF8) << 18) |
                         ((uint32_t)(cont1 & ~0xC0) << 12) |
                         ((uint32_t)(cont2 & ~0xC0) <<  6) |
                          (uint32_t)(cont3 & ~0xC0);

            if (z < 0x10000) // overlong sequence
                return false;
            if (z > 0x10FFFF) // codepoint limit
                return false;

        } else {
            return false; // continuation byte without a lead, or lead for a 5-byte sequence or longer
        }
    }
    return true;
}